

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rmq.cpp
# Opt level: O0

void timing_comp(size_t size)

{
  int iVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  ostream *poVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_end_00;
  reference piVar6;
  difference_type dVar7;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1c0;
  duration<long,_std::ratio<1L,_1000L>_> local_1b8;
  long local_1b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  int *local_190;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_180;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> min2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_160;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_158;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_150;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> min;
  int range_end;
  int range_start;
  int i;
  double minel_queries;
  double rmq_queries;
  type tStack_118;
  int rand_tests;
  duration<long,_std::ratio<1L,_1000L>_> local_110;
  long local_108;
  int *local_100;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  undefined1 local_f0 [8];
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
  rmq;
  duration<long,_std::ratio<1L,_1000L>_> local_78;
  long local_70;
  long duration_ms;
  time_point now;
  allocator<int> local_31;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> els;
  time_point start_time;
  size_t size_local;
  
  els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,size,&local_31);
  std::allocator<int>::~allocator(&local_31);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_30);
  iVar4 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_30)
  ;
  std::
  generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,timing_comp(unsigned_long)::__0>
            (iVar3._M_current,iVar4._M_current);
  duration_ms = std::chrono::_V2::system_clock::now();
  rmq.block_mins.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&duration_ms,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
  local_78.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 &rmq.block_mins.
                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_70 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_78);
  els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)duration_ms;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Generate input: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_70);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_f8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_30);
  local_100 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_30);
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
  rmq((rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
       *)local_f0,local_f8,
      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_100,0x100,8);
  local_108 = std::chrono::_V2::system_clock::now();
  duration_ms = local_108;
  tStack_118 = std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&duration_ms,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  local_110.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&stack0xfffffffffffffee8);
  local_70 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_110);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Construction RMQ: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_70);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
  range_end = 0;
  while( true ) {
    if ((int)size <= range_end) {
      local_1b0 = std::chrono::_V2::system_clock::now();
      duration_ms = local_1b0;
      local_1c0.__r =
           (rep)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&duration_ms,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      local_1b8.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_1c0);
      local_70 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1b8);
      poVar5 = std::operator<<((ostream *)&std::cout,"RMQ              queries total time: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)local_70 / 1000.0);
      poVar5 = std::operator<<(poVar5,"s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
      ::~rmq((rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
              *)local_f0);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30)
      ;
      return;
    }
    iVar1 = rand();
    iVar2 = (int)((ulong)(long)iVar1 % (size - 2));
    iVar1 = rand();
    min._M_current._4_4_ = (int)((ulong)(long)iVar1 % (~(long)iVar2 + size)) + iVar2;
    local_160._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_30);
    local_158 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_160,(long)iVar2);
    min2._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_30);
    range_end_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(&min2,(long)min._M_current._4_4_);
    local_150 = rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
                ::query((rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
                         *)local_f0,local_158,range_end_00);
    local_188._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_30);
    local_180 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_188,(long)iVar2);
    local_198._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_30);
    local_190 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator+(&local_198,(long)min._M_current._4_4_);
    local_178 = std::
                min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (local_180,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_190);
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_150);
    iVar1 = *piVar6;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_178);
    if (iVar1 != *piVar6) break;
    poVar5 = std::operator<<((ostream *)&std::cerr,".");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    range_end = range_end + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: different mins for range(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  poVar5 = std::operator<<(poVar5,",");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,min._M_current._4_4_);
  poVar5 = std::operator<<(poVar5,")");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cerr,"rmq at ");
  local_1a0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_30);
  dVar7 = __gnu_cxx::operator-(&local_150,&local_1a0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
  poVar5 = std::operator<<(poVar5," = ");
  piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_150);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cerr,"mne at ");
  local_1a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_30);
  dVar7 = __gnu_cxx::operator-(&local_178,&local_1a8);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
  poVar5 = std::operator<<(poVar5," = ");
  piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_178);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void timing_comp(std::size_t size)
{
    auto start_time = std::chrono::high_resolution_clock::now();
    std::vector<int> els(size);
    std::generate(els.begin(), els.end(), [](){return std::rand() % 1000;});

    auto now = std::chrono::high_resolution_clock::now();
    long duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    start_time = now;
    std::cerr << "Generate input: " << duration_ms << std::endl;

    rmq<std::vector<int>::iterator> rmq(els.begin(), els.end());

    now = std::chrono::high_resolution_clock::now();
    duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    std::cerr << "Construction RMQ: " << duration_ms << std::endl;

    int rand_tests = size;
    double rmq_queries = 0.0;
    double minel_queries = 0.0;
    start_time = std::chrono::high_resolution_clock::now();
    for (int i = 0; i < rand_tests; ++i)
    {
        // get random range and start timing
        int range_start = std::rand() % (size - 2);
        int range_end = std::rand() % (size - range_start - 1) + range_start;

        // query RMQ
        auto min = rmq.query(els.begin()+range_start, els.begin()+range_end);

        // stop timing
        //now = std::chrono::high_resolution_clock::now();
        //duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
        //rmq_queries += duration_ms;
        //start_time = now;

        // use linear std::min_element
        auto min2 = std::min_element(els.begin()+range_start, els.begin() + range_end);

        // stop time
        //now = std::chrono::high_resolution_clock::now();
        //duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
        //minel_queries += duration_ms;

        if (*min != *min2)
        {
            std::cerr << "ERROR: different mins for range(" << range_start << "," << range_end << ")" << std::endl;
            std::cerr << "rmq at " << min - els.begin() << " = " << *min << std::endl;
            std::cerr << "mne at " << min2 - els.begin() << " = " << *min2 << std::endl;
            exit(EXIT_FAILURE);
        }
        else
            std::cerr << "." << std::endl;
    }

    now = std::chrono::high_resolution_clock::now();
    duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    std::cout << "RMQ              queries total time: " << duration_ms/1000.0 << "s" << std::endl;
    //std::cout << "std::min_element queries total time: " << minel_queries/1000.0 << "s" << std::endl;
}